

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O1

void __thiscall viface::VIface::VIface(VIface *this,string *name,bool tap,int id)

{
  pointer pcVar1;
  _Head_base<0UL,_viface::VIfaceImpl_*,_false> this_00;
  string local_50;
  
  this_00._M_head_impl = (VIfaceImpl *)operator_new(0x168);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  VIfaceImpl::VIfaceImpl(this_00._M_head_impl,&local_50,tap,id);
  (this->pimpl)._M_t.
  super___uniq_ptr_impl<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_>._M_t.
  super__Tuple_impl<0UL,_viface::VIfaceImpl_*,_std::default_delete<viface::VIfaceImpl>_>.
  super__Head_base<0UL,_viface::VIfaceImpl_*,_false>._M_head_impl = this_00._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

VIface::VIface(string name, bool tap, int id) :
    pimpl(new VIfaceImpl(name, tap, id))
{}